

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  stCoEpoll_t *ctx;
  int iVar4;
  bool bVar5;
  stCoRoutine_t *co;
  stEndPoint endpoint;
  sigaction sa;
  
  endpoint.ip = argv[1];
  iVar1 = atoi(argv[2]);
  endpoint.port = (unsigned_short)iVar1;
  iVar1 = atoi(argv[3]);
  iVar2 = atoi(argv[4]);
  sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
  iVar4 = 0;
  if (0 < iVar2) {
    iVar4 = iVar2;
  }
  iVar4 = iVar4 + 1;
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return 0;
    }
    _Var3 = fork();
  } while (0 < _Var3);
  if (_Var3 < 0) {
    return 0;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    co = (stCoRoutine_t *)0x0;
    co_create(&co,(stCoRoutineAttr_t *)0x0,readwrite_routine,&endpoint);
    co_resume(co);
  }
  ctx = co_get_epoll_ct();
  co_eventloop(ctx,(pfn_co_eventloop_t)0x0,(void *)0x0);
  exit(0);
}

Assistant:

int main(int argc,char *argv[])
{
	stEndPoint endpoint;
	endpoint.ip = argv[1];
	endpoint.port = atoi(argv[2]);
	int cnt = atoi( argv[3] );
	int proccnt = atoi( argv[4] );
	
	struct sigaction sa;
	sa.sa_handler = SIG_IGN;
	sigaction( SIGPIPE, &sa, NULL );
	
	for(int k=0;k<proccnt;k++)
	{

		pid_t pid = fork();
		if( pid > 0 )
		{
			continue;
		}
		else if( pid < 0 )
		{
			break;
		}
		for(int i=0;i<cnt;i++)
		{
			stCoRoutine_t *co = 0;
			co_create( &co,NULL,readwrite_routine, &endpoint);
			co_resume( co );
		}
		co_eventloop( co_get_epoll_ct(),0,0 );

		exit(0);
	}
	return 0;
}